

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref cashew::ValueBuilder::makeSwitch(Ref input)

{
  Ref RVar1;
  Ref r;
  Value *pVVar2;
  
  RVar1 = makeRawArray(3);
  r = makeRawString((IString *)&SWITCH);
  pVVar2 = Value::push_back(RVar1.inst,r);
  pVVar2 = Value::push_back(pVVar2,input);
  RVar1 = makeRawArray(0);
  RVar1.inst = Value::push_back(pVVar2,RVar1);
  return (Ref)RVar1.inst;
}

Assistant:

static Ref makeSwitch(Ref input) {
    return &makeRawArray(3)
              ->push_back(makeRawString(SWITCH))
              .push_back(input)
              .push_back(makeRawArray());
  }